

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void print_basic_type(FILE *f,basic_type basic_type)

{
  char *__ptr;
  size_t sStack_8;
  
  switch(basic_type) {
  case TP_UNDEF:
    __ptr = "undef type";
    sStack_8 = 10;
    break;
  case TP_VOID:
    __ptr = "void";
    goto LAB_0014d879;
  case TP_BOOL:
    __ptr = "bool";
    goto LAB_0014d879;
  case TP_CHAR:
    __ptr = "char";
    goto LAB_0014d879;
  case TP_SCHAR:
    __ptr = "signed char";
    goto LAB_0014d806;
  case TP_UCHAR:
    __ptr = "unsigned char";
    goto LAB_0014d858;
  case TP_SHORT:
    __ptr = "short";
    goto LAB_0014d86e;
  case TP_USHORT:
    __ptr = "unsigned short";
    sStack_8 = 0xe;
    break;
  case TP_INT:
    __ptr = "int";
    sStack_8 = 3;
    break;
  case TP_UINT:
    __ptr = "unsigned int";
    sStack_8 = 0xc;
    break;
  case TP_LONG:
    __ptr = "long";
LAB_0014d879:
    sStack_8 = 4;
    break;
  case TP_ULONG:
    __ptr = "unsigned long";
LAB_0014d858:
    sStack_8 = 0xd;
    break;
  case TP_LLONG:
    __ptr = "long long";
    sStack_8 = 9;
    break;
  case TP_ULLONG:
    __ptr = "unsigned long long";
    sStack_8 = 0x12;
    break;
  case TP_FLOAT:
    __ptr = "float";
LAB_0014d86e:
    sStack_8 = 5;
    break;
  case TP_DOUBLE:
    __ptr = "double";
    sStack_8 = 6;
    break;
  case TP_LDOUBLE:
    __ptr = "long double";
LAB_0014d806:
    sStack_8 = 0xb;
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x3563,"void print_basic_type(FILE *, enum basic_type)");
  }
  fwrite(__ptr,sStack_8,1,(FILE *)f);
  return;
}

Assistant:

static void print_basic_type (FILE *f, enum basic_type basic_type) {
  switch (basic_type) {
  case TP_UNDEF: fprintf (f, "undef type"); break;
  case TP_VOID: fprintf (f, "void"); break;
  case TP_BOOL: fprintf (f, "bool"); break;
  case TP_CHAR: fprintf (f, "char"); break;
  case TP_SCHAR: fprintf (f, "signed char"); break;
  case TP_UCHAR: fprintf (f, "unsigned char"); break;
  case TP_SHORT: fprintf (f, "short"); break;
  case TP_USHORT: fprintf (f, "unsigned short"); break;
  case TP_INT: fprintf (f, "int"); break;
  case TP_UINT: fprintf (f, "unsigned int"); break;
  case TP_LONG: fprintf (f, "long"); break;
  case TP_ULONG: fprintf (f, "unsigned long"); break;
  case TP_LLONG: fprintf (f, "long long"); break;
  case TP_ULLONG: fprintf (f, "unsigned long long"); break;
  case TP_FLOAT: fprintf (f, "float"); break;
  case TP_DOUBLE: fprintf (f, "double"); break;
  case TP_LDOUBLE: fprintf (f, "long double"); break;
  default: assert (FALSE);
  }
}